

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O0

SUNMatrix SUNSparseFromBandMatrix(SUNMatrix Ad,realtype droptol,int sparsetype)

{
  long M_00;
  long N_00;
  SUNMatrix_ID SVar1;
  long local_a0;
  long local_90;
  long local_88;
  long local_78;
  long local_70;
  long local_60;
  SUNMatrix As;
  sunindextype N;
  sunindextype M;
  sunindextype nnz;
  sunindextype j;
  sunindextype i;
  int sparsetype_local;
  realtype droptol_local;
  SUNMatrix Ad_local;
  
  if ((sparsetype == 1) || (sparsetype == 0)) {
    if (0.0 <= droptol) {
      SVar1 = SUNMatGetID(Ad);
      if (SVar1 == SUNMATRIX_BAND) {
        M_00 = *Ad->content;
        N_00 = *(long *)((long)Ad->content + 8);
        M = 0;
        for (nnz = 0; nnz < N_00; nnz = nnz + 1) {
          if (nnz - *(long *)((long)Ad->content + 0x18) < 0) {
            local_60 = 0;
          }
          else {
            local_60 = nnz - *(long *)((long)Ad->content + 0x18);
          }
          j = local_60;
          while( true ) {
            if (M_00 + -1 < nnz + *(long *)((long)Ad->content + 0x20)) {
              local_70 = M_00 + -1;
            }
            else {
              local_70 = nnz + *(long *)((long)Ad->content + 0x20);
            }
            if (local_70 < j) break;
            M = (int)(uint)(droptol <
                           ABS(*(double *)
                                (*(long *)(*(long *)((long)Ad->content + 0x40) + nnz * 8) +
                                ((j - nnz) + *(long *)((long)Ad->content + 0x28)) * 8))) + M;
            j = j + 1;
          }
        }
        Ad_local = SUNSparseMatrix(M_00,N_00,M,sparsetype);
        if (Ad_local == (SUNMatrix)0x0) {
          Ad_local = (SUNMatrix)0x0;
        }
        else {
          M = 0;
          if (sparsetype == 0) {
            for (nnz = 0; nnz < N_00; nnz = nnz + 1) {
              *(sunindextype *)(*(long *)((long)Ad_local->content + 0x38) + nnz * 8) = M;
              if (nnz - *(long *)((long)Ad->content + 0x18) < 0) {
                local_78 = 0;
              }
              else {
                local_78 = nnz - *(long *)((long)Ad->content + 0x18);
              }
              j = local_78;
              while( true ) {
                if (M_00 + -1 < nnz + *(long *)((long)Ad->content + 0x20)) {
                  local_88 = M_00 + -1;
                }
                else {
                  local_88 = nnz + *(long *)((long)Ad->content + 0x20);
                }
                if (local_88 < j) break;
                if (droptol < ABS(*(double *)
                                   (*(long *)(*(long *)((long)Ad->content + 0x40) + nnz * 8) +
                                   ((j - nnz) + *(long *)((long)Ad->content + 0x28)) * 8))) {
                  *(sunindextype *)(*(long *)((long)Ad_local->content + 0x30) + M * 8) = j;
                  *(undefined8 *)(*(long *)((long)Ad_local->content + 0x20) + M * 8) =
                       *(undefined8 *)
                        (*(long *)(*(long *)((long)Ad->content + 0x40) + nnz * 8) +
                        ((j - nnz) + *(long *)((long)Ad->content + 0x28)) * 8);
                  M = M + 1;
                }
                j = j + 1;
              }
            }
            *(sunindextype *)(*(long *)((long)Ad_local->content + 0x38) + N_00 * 8) = M;
          }
          else {
            for (j = 0; j < M_00; j = j + 1) {
              *(sunindextype *)(*(long *)((long)Ad_local->content + 0x38) + j * 8) = M;
              if (j - *(long *)((long)Ad->content + 0x20) < 0) {
                local_90 = 0;
              }
              else {
                local_90 = j - *(long *)((long)Ad->content + 0x20);
              }
              nnz = local_90;
              while( true ) {
                if (N_00 + -1 < j + *(long *)((long)Ad->content + 0x18)) {
                  local_a0 = N_00 + -1;
                }
                else {
                  local_a0 = j + *(long *)((long)Ad->content + 0x18);
                }
                if (local_a0 < nnz) break;
                if (droptol < ABS(*(double *)
                                   (*(long *)(*(long *)((long)Ad->content + 0x40) + nnz * 8) +
                                   ((j - nnz) + *(long *)((long)Ad->content + 0x28)) * 8))) {
                  *(sunindextype *)(*(long *)((long)Ad_local->content + 0x30) + M * 8) = nnz;
                  *(undefined8 *)(*(long *)((long)Ad_local->content + 0x20) + M * 8) =
                       *(undefined8 *)
                        (*(long *)(*(long *)((long)Ad->content + 0x40) + nnz * 8) +
                        ((j - nnz) + *(long *)((long)Ad->content + 0x28)) * 8);
                  M = M + 1;
                }
                nnz = nnz + 1;
              }
            }
            *(sunindextype *)(*(long *)((long)Ad_local->content + 0x38) + M_00 * 8) = M;
          }
        }
      }
      else {
        Ad_local = (SUNMatrix)0x0;
      }
    }
    else {
      Ad_local = (SUNMatrix)0x0;
    }
  }
  else {
    Ad_local = (SUNMatrix)0x0;
  }
  return Ad_local;
}

Assistant:

SUNMatrix SUNSparseFromBandMatrix(SUNMatrix Ad, realtype droptol, int sparsetype)
{
  sunindextype i, j, nnz;
  sunindextype M, N;
  SUNMatrix As;

  /* check for legal sparsetype, droptol and input matrix type */
  if ( (sparsetype != CSR_MAT) && (sparsetype != CSC_MAT) )
    return NULL;
  if ( droptol < ZERO )
    return NULL;
  if (SUNMatGetID(Ad) != SUNMATRIX_BAND)
    return NULL;
  
  /* set size of new matrix */
  M = SM_ROWS_B(Ad);
  N = SM_COLUMNS_B(Ad);

  /* determine total number of nonzeros */
  nnz = 0;
  for (j=0; j<N; j++)
    for (i=SUNMAX(0,j-SM_UBAND_B(Ad)); i<=SUNMIN(M-1,j+SM_LBAND_B(Ad)); i++)
      nnz += (SUNRabs(SM_ELEMENT_B(Ad,i,j)) > droptol);

  /* allocate sparse matrix */
  As = SUNSparseMatrix(M, N, nnz, sparsetype);
  if (As == NULL)  return NULL;

  /* copy nonzeros from Ad into As, based on CSR/CSC type */
  nnz = 0;
  if (sparsetype == CSC_MAT) {
    for (j=0; j<N; j++) {
      (SM_INDEXPTRS_S(As))[j] = nnz;
      for (i=SUNMAX(0,j-SM_UBAND_B(Ad)); i<=SUNMIN(M-1,j+SM_LBAND_B(Ad)); i++) {
        if ( SUNRabs(SM_ELEMENT_B(Ad,i,j)) > droptol ) { 
          (SM_INDEXVALS_S(As))[nnz] = i;
          (SM_DATA_S(As))[nnz++] = SM_ELEMENT_B(Ad,i,j);
        }
      }
    }
    (SM_INDEXPTRS_S(As))[N] = nnz;
  } else {       /* CSR_MAT */
    for (i=0; i<M; i++) {
      (SM_INDEXPTRS_S(As))[i] = nnz;
      for (j=SUNMAX(0,i-SM_LBAND_B(Ad)); j<=SUNMIN(N-1,i+SM_UBAND_B(Ad)); j++) {
        if ( SUNRabs(SM_ELEMENT_B(Ad,i,j)) > droptol ) { 
          (SM_INDEXVALS_S(As))[nnz] = j;
          (SM_DATA_S(As))[nnz++] = SM_ELEMENT_B(Ad,i,j);
        }
      }
    }
    (SM_INDEXPTRS_S(As))[M] = nnz;
  }

  return(As);
}